

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

CURLcode parse_remote_port(Curl_easy *data,connectdata *conn)

{
  char cVar1;
  long lVar2;
  unsigned_short uVar3;
  int iVar4;
  CURLcode CVar5;
  ulong uVar6;
  uint uVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  bool bVar11;
  char endbracket;
  in6_addr in6;
  
  iVar4 = __isoc99_sscanf((conn->host).name,"[%*45[0123456789abcdefABCDEF:.]%c",&endbracket);
  if ((iVar4 == 1) && (endbracket == ']')) {
    (conn->bits).ipv6_ip = true;
    pcVar8 = (conn->host).name + 1;
    (conn->host).name = pcVar8;
    pcVar8 = strchr(pcVar8,0x5d);
    if (pcVar8 == (char *)0x0) {
LAB_0011c4ac:
      pcVar8 = (char *)0x0;
      goto LAB_0011c4d2;
    }
    *pcVar8 = '\0';
    cVar1 = pcVar8[1];
    if (cVar1 == '\0') goto LAB_0011c4ac;
    if (cVar1 == ':') {
      pcVar8 = pcVar8 + 1;
      goto LAB_0011c4d2;
    }
    uVar7 = (uint)cVar1;
    pcVar8 = "IPv6 closing bracket followed by \'%c\'";
LAB_0011c681:
    Curl_failf(data,pcVar8,(ulong)uVar7);
LAB_0011c68b:
    CVar5 = CURLE_URL_MALFORMAT;
  }
  else {
    iVar4 = inet_pton(10,(conn->host).name,&in6);
    if (0 < iVar4) {
      Curl_failf(data,"IPv6 numerical address used in URL without brackets");
      return CURLE_URL_MALFORMAT;
    }
    pcVar8 = strchr((conn->host).name,0x3a);
LAB_0011c4d2:
    lVar2 = (data->set).use_port;
    if ((lVar2 == 0) || ((data->state).allow_port != true)) {
      if (pcVar8 != (char *)0x0) {
        uVar6 = strtol(pcVar8 + 1,(char **)&in6,10);
        if (0xffff < uVar6) {
          Curl_failf(data,"Port number out of range");
          goto LAB_0011c68b;
        }
        uVar7 = (uint)*(char *)in6.__in6_u._0_8_;
        if (uVar7 != 0) {
          pcVar8 = "Port number ended with \'%c\'";
          goto LAB_0011c681;
        }
        *pcVar8 = '\0';
        if ((char *)in6.__in6_u._0_8_ != pcVar8 + 1) {
          uVar3 = curlx_ultous(uVar6);
          conn->remote_port = (uint)uVar3;
        }
      }
    }
    else {
      conn->remote_port = (uint)lVar2 & 0xffff;
      if (pcVar8 != (char *)0x0) {
        *pcVar8 = '\0';
      }
      if ((conn->bits).httpproxy == true) {
        in6.__in6_u.__u6_addr32[2] = 0;
        in6.__in6_u._0_8_ = 0;
        if ((conn->bits).type_set == true) {
          uVar6 = 0x41;
          if ((data->set).prefer_ascii == false) {
            uVar6 = (ulong)(((data->set).ftp_list_only ^ 1) * 5 + 0x44);
          }
          curl_msnprintf((char *)&in6,0xc,";type=%c",uVar6);
        }
        pcVar8 = "[";
        bVar11 = (conn->bits).ipv6_ip == false;
        if (bVar11) {
          pcVar8 = "";
        }
        pcVar9 = "]";
        if (bVar11) {
          pcVar9 = "";
        }
        pcVar10 = "/";
        if ((data->state).slash_removed == false) {
          pcVar10 = "";
        }
        pcVar8 = curl_maprintf("%s://%s%s%s:%hu%s%s%s",conn->given->scheme,pcVar8,(conn->host).name,
                               pcVar9,(ulong)(uint)conn->remote_port,pcVar10,(data->state).path,&in6
                              );
        if (pcVar8 == (char *)0x0) {
          CVar5 = CURLE_OUT_OF_MEMORY;
        }
        else {
          if ((data->change).url_alloc == true) {
            (*Curl_cfree)((data->change).url);
            (data->change).url = (char *)0x0;
            (data->change).url_alloc = false;
          }
          (data->change).url = pcVar8;
          (data->change).url_alloc = true;
          CVar5 = CURLE_URL_MALFORMAT;
        }
        if (pcVar8 == (char *)0x0) {
          return CVar5;
        }
      }
    }
    CVar5 = CURLE_OK;
    if (conn->remote_port < 0) {
      conn->remote_port = (uint)(ushort)conn->given->defport;
      CVar5 = CURLE_OK;
    }
  }
  return CVar5;
}

Assistant:

static CURLcode parse_remote_port(struct Curl_easy *data,
                                  struct connectdata *conn)
{
  char *portptr;
  char endbracket;

  /* Note that at this point, the IPv6 address cannot contain any scope
     suffix as that has already been removed in the parseurlandfillconn()
     function */
  if((1 == sscanf(conn->host.name, "[%*45[0123456789abcdefABCDEF:.]%c",
                  &endbracket)) &&
     (']' == endbracket)) {
    /* this is a RFC2732-style specified IP-address */
    conn->bits.ipv6_ip = TRUE;

    conn->host.name++; /* skip over the starting bracket */
    portptr = strchr(conn->host.name, ']');
    if(portptr) {
      *portptr++ = '\0'; /* zero terminate, killing the bracket */
      if(*portptr) {
        if (*portptr != ':') {
          failf(data, "IPv6 closing bracket followed by '%c'", *portptr);
          return CURLE_URL_MALFORMAT;
        }
      }
      else
        portptr = NULL; /* no port number available */
    }
  }
  else {
#ifdef ENABLE_IPV6
    struct in6_addr in6;
    if(Curl_inet_pton(AF_INET6, conn->host.name, &in6) > 0) {
      /* This is a numerical IPv6 address, meaning this is a wrongly formatted
         URL */
      failf(data, "IPv6 numerical address used in URL without brackets");
      return CURLE_URL_MALFORMAT;
    }
#endif

    portptr = strchr(conn->host.name, ':');
  }

  if(data->set.use_port && data->state.allow_port) {
    /* if set, we use this and ignore the port possibly given in the URL */
    conn->remote_port = (unsigned short)data->set.use_port;
    if(portptr)
      *portptr = '\0'; /* cut off the name there anyway - if there was a port
                      number - since the port number is to be ignored! */
    if(conn->bits.httpproxy) {
      /* we need to create new URL with the new port number */
      char *url;
      char type[12]="";

      if(conn->bits.type_set)
        snprintf(type, sizeof(type), ";type=%c",
                 data->set.prefer_ascii?'A':
                 (data->set.ftp_list_only?'D':'I'));

      /*
       * This synthesized URL isn't always right--suffixes like ;type=A are
       * stripped off. It would be better to work directly from the original
       * URL and simply replace the port part of it.
       */
      url = aprintf("%s://%s%s%s:%hu%s%s%s", conn->given->scheme,
                    conn->bits.ipv6_ip?"[":"", conn->host.name,
                    conn->bits.ipv6_ip?"]":"", conn->remote_port,
                    data->state.slash_removed?"/":"", data->state.path,
                    type);
      if(!url)
        return CURLE_OUT_OF_MEMORY;

      if(data->change.url_alloc) {
        Curl_safefree(data->change.url);
        data->change.url_alloc = FALSE;
      }

      data->change.url = url;
      data->change.url_alloc = TRUE;
    }
  }
  else if(portptr) {
    /* no CURLOPT_PORT given, extract the one from the URL */

    char *rest;
    long port;

    port = strtol(portptr + 1, &rest, 10);  /* Port number must be decimal */

    if((port < 0) || (port > 0xffff)) {
      /* Single unix standard says port numbers are 16 bits long */
      failf(data, "Port number out of range");
      return CURLE_URL_MALFORMAT;
    }

    if(rest[0]) {
      failf(data, "Port number ended with '%c'", rest[0]);
      return CURLE_URL_MALFORMAT;
    }

    if(rest != &portptr[1]) {
      *portptr = '\0'; /* cut off the name there */
      conn->remote_port = curlx_ultous(port);
    }
    else {
      /* Browser behavior adaptation. If there's a colon with no digits after,
         just cut off the name there which makes us ignore the colon and just
         use the default port. Firefox and Chrome both do that. */
      *portptr = '\0';
    }
  }

  /* only if remote_port was not already parsed off the URL we use the
     default port number */
  if(conn->remote_port < 0)
    conn->remote_port = (unsigned short)conn->given->defport;

  return CURLE_OK;
}